

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void compact_alphabet(vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  uint uVar1;
  uint *puVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __result;
  uint *puVar3;
  uchar uVar4;
  uint *puVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range1;
  uint uVar6;
  pointer puVar7;
  bool bVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> elems;
  allocator_type local_21;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_20;
  
  puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar5 = puVar3 + 1;
  if (puVar5 != puVar2 && puVar3 != puVar2) {
    uVar6 = *puVar3;
    do {
      uVar1 = *puVar5;
      bVar8 = uVar6 < uVar1;
      if (uVar6 <= uVar1) {
        uVar6 = uVar1;
      }
      if (bVar8) {
        puVar3 = puVar5;
      }
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar2);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_20,(ulong)(*puVar3 + 1),&local_21);
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[*puVar3] = '\x01';
  }
  if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = '\0';
    puVar7 = local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (*puVar7 != '\0') {
        *puVar7 = uVar4;
        uVar4 = uVar4 + '\x01';
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar3 == puVar2) {
    if (local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
  }
  else {
    do {
      *puVar3 = (uint)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start[*puVar3];
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  operator_delete(local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_20.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void compact_alphabet(std::vector<uint32_t>& vec)
{
    uint32_t max_elem = *std::max_element(vec.begin(), vec.end());
    std::vector<uint8_t> elems(max_elem + 1);
    for (const auto& v : vec)
        elems[v] = 1;
    uint32_t cur = 0;
    for (auto& v : elems) {
        if (v != 0) {
            v = cur;
            cur++;
        }
    }
    for (auto& x : vec)
        x = elems[x];
}